

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

HierarchyInstantiationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::HierarchyInstantiationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::ParameterValueAssignmentSyntax*,slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>&,slang::parsing::Token>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,ParameterValueAssignmentSyntax **args_2,
          SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *args_3,Token *args_4)

{
  Token type;
  HierarchyInstantiationSyntax *pHVar1;
  ParameterValueAssignmentSyntax *in_RCX;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_RDX;
  HierarchyInstantiationSyntax *in_RSI;
  undefined8 in_RDI;
  SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *in_R8;
  Info *unaff_retaddr;
  Token in_stack_00000010;
  size_t in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  BumpAllocator *in_stack_ffffffffffffffb8;
  
  pHVar1 = (HierarchyInstantiationSyntax *)
           allocate(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  type.info = unaff_retaddr;
  type.kind = (short)in_RDI;
  type._2_1_ = (char)((ulong)in_RDI >> 0x10);
  type.numFlags.raw = (char)((ulong)in_RDI >> 0x18);
  type.rawLen = (int)((ulong)in_RDI >> 0x20);
  slang::syntax::HierarchyInstantiationSyntax::HierarchyInstantiationSyntax
            (in_RSI,in_RDX,type,in_RCX,in_R8,in_stack_00000010);
  return pHVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }